

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_setup_extension_permutation(SSL_HANDSHAKE *hs)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  Array<unsigned_char> permutation;
  uint32_t seeds [27];
  
  if ((hs->config->field_0x10e & 4) == 0) {
    return true;
  }
  permutation.data_ = (uchar *)0x0;
  permutation.size_ = 0;
  iVar3 = RAND_bytes((uchar *)seeds,0x6c);
  if (iVar3 != 0) {
    bVar2 = Array<unsigned_char>::InitUninitialized(&permutation,0x1c);
    if (bVar2) {
      for (uVar4 = 0; uVar5 = 0x1c, uVar4 != 0x1c; uVar4 = uVar4 + 1) {
        if (permutation.size_ <= uVar4) goto LAB_00133846;
        permutation.data_[uVar4] = (uchar)uVar4;
      }
      while (uVar5 != 1) {
        if ((permutation.size_ <= uVar5 - 1) ||
           (uVar4 = (ulong)seeds[uVar5 - 2] % uVar5, permutation.size_ <= uVar4)) {
LAB_00133846:
          abort();
        }
        uVar1 = permutation.data_[uVar5 - 1];
        permutation.data_[uVar5 - 1] = permutation.data_[uVar4];
        permutation.data_[uVar4] = uVar1;
        uVar5 = uVar5 - 1;
      }
      bVar2 = true;
      Array<unsigned_char>::operator=(&hs->extension_permutation,&permutation);
      goto LAB_00133830;
    }
  }
  bVar2 = false;
LAB_00133830:
  Array<unsigned_char>::~Array(&permutation);
  return bVar2;
}

Assistant:

bool ssl_setup_extension_permutation(SSL_HANDSHAKE *hs) {
  if (!hs->config->permute_extensions) {
    return true;
  }

  static_assert(kNumExtensions <= UINT8_MAX,
                "extensions_permutation type is too small");
  uint32_t seeds[kNumExtensions - 1];
  Array<uint8_t> permutation;
  if (!RAND_bytes(reinterpret_cast<uint8_t *>(seeds), sizeof(seeds)) ||
      !permutation.InitForOverwrite(kNumExtensions)) {
    return false;
  }
  for (size_t i = 0; i < kNumExtensions; i++) {
    permutation[i] = i;
  }
  for (size_t i = kNumExtensions - 1; i > 0; i--) {
    // Set element |i| to a randomly-selected element 0 <= j <= i.
    std::swap(permutation[i], permutation[seeds[i - 1] % (i + 1)]);
  }
  hs->extension_permutation = std::move(permutation);
  return true;
}